

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

string * tinyusdz::unescapeControlSequence(string *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  byte bVar2;
  pointer pcVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  string s;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_48 = 0;
  local_40 = '\0';
  uVar4 = str->_M_string_length;
  local_50._M_p = &local_40;
  if (uVar4 < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar4);
  }
  else {
    uVar4 = str->_M_string_length;
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        pcVar3 = (str->_M_dataplus)._M_p;
        cVar5 = (char)&local_50;
        if (pcVar3[uVar6] != '\\') {
          std::__cxx11::string::push_back(cVar5);
          goto switchD_00142543_caseD_6f;
        }
        uVar1 = uVar6 + 1;
        if (uVar4 <= uVar1) goto switchD_00142543_caseD_6f;
        bVar2 = pcVar3[uVar1];
        if (bVar2 < 0x66) {
          if (bVar2 == 0x5c) {
            std::__cxx11::string::append((char *)&local_50);
          }
          else if ((bVar2 == 0x61) || (bVar2 == 0x62)) goto LAB_00142595;
          goto switchD_00142543_caseD_6f;
        }
        switch(bVar2) {
        case 0x6e:
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x75:
          goto switchD_00142543_caseD_6f;
        case 0x72:
          break;
        case 0x74:
          break;
        case 0x76:
          break;
        default:
          if (bVar2 == 0x66) break;
          goto switchD_00142543_caseD_6f;
        }
LAB_00142595:
        std::__cxx11::string::push_back(cVar5);
        uVar6 = uVar1;
switchD_00142543_caseD_6f:
        uVar6 = uVar6 + 1;
        uVar4 = str->_M_string_length;
      } while (uVar6 < uVar4);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_50._M_p == &local_40) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    __return_storage_ptr__->_M_string_length = local_48;
    local_48 = 0;
    local_40 = '\0';
    local_50._M_p = &local_40;
  }
  if (local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unescapeControlSequence(const std::string &str) {
  std::string s;

  if (str.size() < 2) {
    return str;
  }

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 1 < str.size()) {
        if (str[i + 1] == 'a') {
          s += '\a';
          i++;
        } else if (str[i + 1] == 'b') {
          s += '\b';
          i++;
        } else if (str[i + 1] == 't') {
          s += '\t';
          i++;
        } else if (str[i + 1] == 'v') {
          s += '\v';
          i++;
        } else if (str[i + 1] == 'f') {
          s += '\f';
          i++;
        } else if (str[i + 1] == 'n') {
          s += '\n';
          i++;
        } else if (str[i + 1] == 'r') {
          s += '\r';
          i++;
        } else if (str[i + 1] == '\\') {
          s += "\\";
        } else {
          // ignore backslash
        }
      } else {
        // ignore backslash
      }
    } else {
      s += str[i];
    }
  }

  return s;
}